

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall fw::Texture::Texture(Texture *this,istream *stream,string *filepath)

{
  int iVar1;
  uchar *puVar2;
  size_type sVar3;
  Writer *pWVar4;
  float *image_00;
  stbi_uc *image_01;
  stbi_uc *image_1;
  float *image;
  int local_54;
  int local_50;
  int components;
  int height;
  int width;
  bool isHDR;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string *filepath_local;
  istream *stream_local;
  Texture *this_local;
  
  this->_vptr_Texture = (_func_int **)&PTR__Texture_0028fb70;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filepath;
  std::__cxx11::string::string((string *)&this->_filepath,(string *)filepath);
  loadStream((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,stream);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  iVar1 = stbi_is_hdr_from_memory(puVar2,(int)sVar3);
  height._3_1_ = iVar1 != 0;
  stbi_set_flip_vertically_on_load(1);
  if ((height._3_1_ & 1) == 0) {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    image_01 = stbi_load_from_memory(puVar2,(int)sVar3,&components,&local_50,&local_54,0);
    loadTextureLDR(this,image_01,components,local_50,local_54);
    stbi_image_free(image_01);
  }
  else {
    el::base::Writer::Writer
              ((Writer *)&image,Info,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Texture.cpp"
               ,0x23,"fw::Texture::Texture(std::istream &, const std::string &)",NormalLog,0);
    pWVar4 = el::base::Writer::construct((Writer *)&image,1,"framework");
    pWVar4 = el::base::Writer::operator<<(pWVar4,(char (*) [9])"Texture ");
    pWVar4 = el::base::Writer::operator<<
                       (pWVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               buffer.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    el::base::Writer::operator<<(pWVar4,(char (*) [24])" is high dynamic range.");
    el::base::Writer::~Writer((Writer *)&image);
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    image_00 = stbi_loadf_from_memory(puVar2,(int)sVar3,&components,&local_50,&local_54,0);
    loadTextureHDR(this,image_00,components,local_50,local_54);
    stbi_image_free(image_00);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

Texture::Texture(
    std::istream& stream,
    const std::string& filepath
):
    _filepath{filepath}
{
    auto buffer = loadStream(stream);
    bool isHDR = stbi_is_hdr_from_memory(buffer.data(), buffer.size());

    stbi_set_flip_vertically_on_load(true);
    int width, height, components;

    if (isHDR)
    {
        LOG(INFO) << "Texture " << filepath << " is high dynamic range.";

        auto image = stbi_loadf_from_memory(
            buffer.data(), buffer.size(), &width, &height, &components, 0
        );

        loadTextureHDR(image, width, height, components);
        stbi_image_free(image);
    }
    else
    {
        auto image = stbi_load_from_memory(
            buffer.data(), buffer.size(), &width, &height, &components, 0
        );

        loadTextureLDR(image, width, height, components);
        stbi_image_free(image);
    }
}